

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_shift_r(mbedtls_mpi *X,size_t count)

{
  mbedtls_mpi_uint *pmVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  
  uVar4 = count >> 6;
  bVar2 = (byte)count & 0x3f;
  if ((X->n < uVar4) || ((count & 0x3f) != 0 && uVar4 == X->n)) {
    iVar3 = mbedtls_mpi_grow(X,1);
    if (iVar3 == 0) {
      memset(X->p,0,X->n << 3);
      *X->p = 0;
      X->s = 1;
    }
  }
  else {
    if (0x3f < count) {
      if (X->n == uVar4) {
        uVar5 = 0;
      }
      else {
        pmVar1 = X->p;
        uVar5 = 0;
        do {
          pmVar1[uVar5] = pmVar1[uVar4 + uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar5 < X->n - uVar4);
      }
      if (uVar5 < X->n) {
        pmVar1 = X->p;
        do {
          pmVar1[uVar5] = 0;
          uVar5 = uVar5 + 1;
        } while (uVar5 < X->n);
      }
    }
    iVar3 = 0;
    if (((count & 0x3f) != 0) && (sVar6 = X->n, sVar6 != 0)) {
      pmVar1 = X->p;
      iVar3 = 0;
      uVar4 = 0;
      do {
        uVar5 = pmVar1[sVar6 - 1];
        pmVar1[sVar6 - 1] = uVar5 >> bVar2 | uVar4;
        sVar6 = sVar6 - 1;
        uVar4 = uVar5 << (0x40 - bVar2 & 0x3f);
      } while (sVar6 != 0);
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_shift_r( mbedtls_mpi *X, size_t count )
{
    size_t i, v0, v1;
    mbedtls_mpi_uint r0 = 0, r1;
    MPI_VALIDATE_RET( X != NULL );

    v0 = count /  biL;
    v1 = count & (biL - 1);

    if( v0 > X->n || ( v0 == X->n && v1 > 0 ) )
        return mbedtls_mpi_lset( X, 0 );

    /*
     * shift by count / limb_size
     */
    if( v0 > 0 )
    {
        for( i = 0; i < X->n - v0; i++ )
            X->p[i] = X->p[i + v0];

        for( ; i < X->n; i++ )
            X->p[i] = 0;
    }

    /*
     * shift by count % limb_size
     */
    if( v1 > 0 )
    {
        for( i = X->n; i > 0; i-- )
        {
            r1 = X->p[i - 1] << (biL - v1);
            X->p[i - 1] >>= v1;
            X->p[i - 1] |= r0;
            r0 = r1;
        }
    }

    return( 0 );
}